

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderSetFloatAttribute(ImfHeader *hdr,char *name,float value)

{
  undefined1 uVar1;
  TypedAttribute<float> *this;
  float *pfVar2;
  ImfHeader *in_RDI;
  float in_XMM0_Da;
  char *in_stack_00000040;
  Header *in_stack_00000048;
  exception *e;
  Attribute *in_stack_00000520;
  char *in_stack_00000528;
  Header *in_stack_00000530;
  Header *in_stack_ffffffffffffff38;
  TypedAttribute<float> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  
  anon_unknown.dwarf_70604::header(in_RDI);
  Imf_3_4::Header::find(in_stack_00000048,in_stack_00000040);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff40,(Iterator *)in_stack_ffffffffffffff38);
  anon_unknown.dwarf_70604::header(in_RDI);
  Imf_3_4::Header::end(in_stack_ffffffffffffff38);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff40,(Iterator *)in_stack_ffffffffffffff38);
  uVar1 = Imf_3_4::operator==((ConstIterator *)in_stack_ffffffffffffff40,
                              (ConstIterator *)in_stack_ffffffffffffff38);
  if ((bool)uVar1) {
    anon_unknown.dwarf_70604::header(in_RDI);
    Imf_3_4::TypedAttribute<float>::TypedAttribute
              (in_stack_ffffffffffffff40,(float *)in_stack_ffffffffffffff38);
    Imf_3_4::Header::insert(in_stack_00000530,in_stack_00000528,in_stack_00000520);
    Imf_3_4::TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)0x19b561);
  }
  else {
    anon_unknown.dwarf_70604::header(in_RDI);
    this = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<float>>
                     ((Header *)CONCAT17(uVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68)
    ;
    pfVar2 = Imf_3_4::TypedAttribute<float>::value(this);
    *pfVar2 = in_XMM0_Da;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetFloatAttribute (ImfHeader* hdr, const char name[], float value)
{
    try
    {
        if (header (hdr)->find (name) == header (hdr)->end ())
        {
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::FloatAttribute (value));
        }
        else
        {
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::FloatAttribute> (name)
                .value () = value;
        }

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}